

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.test.cpp
# Opt level: O2

string * chunkMF4_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 1.001000+3 9.991673-1          0          0          0          0 125 4  5     \n 1.123400+6 1.123400+6          0          0          1          4 125 4  5     \n          2          2                                             125 4  5     \n 1.000000-5 1.000000+0 2.000000+7 2.000000+0                       125 4  5     \n                                                                   125 4  0     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string chunkMF4() {

  // this is a dummy MF4, not ENDF legal
  return
    " 1.001000+3 9.991673-1          0          0          0          0 125 4  5     \n"
    " 1.123400+6 1.123400+6          0          0          1          4 125 4  5     \n"
    "          2          2                                             125 4  5     \n"
    " 1.000000-5 1.000000+0 2.000000+7 2.000000+0                       125 4  5     \n"
    "                                                                   125 4  0     \n";
}